

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

string * __thiscall
Catch::Detail::
rangeToString<__gnu_cxx::__normal_iterator<std::vector<int,std::allocator<int>>const*,std::vector<std::vector<int,std::allocator<int>>,std::allocator<std::vector<int,std::allocator<int>>>>>,__gnu_cxx::__normal_iterator<std::vector<int,std::allocator<int>>const*,std::vector<std::vector<int,std::allocator<int>>,std::allocator<std::vector<int,std::allocator<int>>>>>>
          (string *__return_storage_ptr__,Detail *this,
          __normal_iterator<const_std::vector<int,_std::allocator<int>_>_*,_std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_>
          first,__normal_iterator<const_std::vector<int,_std::allocator<int>_>_*,_std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_>
                last)

{
  vector<int,_std::allocator<int>_> *range;
  vector<int,_std::allocator<int>_> *range_00;
  Catch *this_00;
  ReusableStringStream rss;
  ReusableStringStream local_60;
  string local_48;
  
  ReusableStringStream::ReusableStringStream(&local_60);
  std::operator<<(local_60.m_oss,"{ ");
  if (this != (Detail *)first._M_current) {
    rangeToString<std::vector<int,std::allocator<int>>>(&local_48,(Catch *)this,range);
    std::operator<<(local_60.m_oss,(string *)&local_48);
    std::__cxx11::string::~string((string *)&local_48);
    for (this_00 = (Catch *)(this + 0x18); this_00 != (Catch *)first._M_current;
        this_00 = this_00 + 0x18) {
      std::operator<<(local_60.m_oss,", ");
      rangeToString<std::vector<int,std::allocator<int>>>(&local_48,this_00,range_00);
      std::operator<<(local_60.m_oss,(string *)&local_48);
      std::__cxx11::string::~string((string *)&local_48);
    }
  }
  std::operator<<(local_60.m_oss," }");
  ReusableStringStream::str_abi_cxx11_((string *)__return_storage_ptr__,&local_60);
  ReusableStringStream::~ReusableStringStream(&local_60);
  return __return_storage_ptr__;
}

Assistant:

std::string rangeToString(InputIterator first, Sentinel last) {
            ReusableStringStream rss;
            rss << "{ ";
            if (first != last) {
                rss << ::Catch::Detail::stringify(*first);
                for (++first; first != last; ++first)
                    rss << ", " << ::Catch::Detail::stringify(*first);
            }
            rss << " }";
            return rss.str();
        }